

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<double>::MultAdd
          (TPZSkylMatrix<double> *this,TPZFMatrix<double> *x,TPZFMatrix<double> *y,
          TPZFMatrix<double> *z,double alpha,double beta,int opt)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  double **ppdVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int64_t iVar12;
  int64_t iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double extraout_XMM0_Qa;
  double dVar19;
  long local_70;
  
  if (opt == 0) {
    iVar12 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (iVar12 == (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) goto LAB_00cb9f9b;
LAB_00cb9fa1:
    TPZMatrix<double>::Error
              ("virtual void TPZSkylMatrix<double>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = double]"
               ," <matrixs with incompatible dimensions>");
    iVar12 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  }
  else {
    iVar12 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
LAB_00cb9f9b:
    if ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow != iVar12) goto LAB_00cb9fa1;
  }
  if ((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == iVar12) {
    lVar4 = (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    lVar9 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    iVar13 = lVar4;
    if (lVar4 == lVar9) goto LAB_00cb9fed;
  }
  else {
    lVar9 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  }
  (*(z->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (z,iVar12,lVar9);
  lVar4 = (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  iVar13 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
LAB_00cb9fed:
  if ((((iVar13 != (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol) || (iVar13 != lVar4)) ||
      (lVar9 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
      lVar9 != (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow)) ||
     (lVar9 != (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x.Cols = ",9);
    poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," y.Cols()",9);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," z.Cols() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," x.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," y.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," z.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    TPZMatrix<double>::Error
              ("virtual void TPZSkylMatrix<double>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = double]"
               ," incompatible dimensions\n");
  }
  TPZMatrix<double>::PrepareZ(&this->super_TPZMatrix<double>,y,z,beta,opt);
  lVar9 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (0 < lVar9) {
    lVar4 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_70 = 0;
    lVar10 = 0;
    do {
      if (0 < lVar4) {
        ppdVar6 = (this->fElem).fStore;
        lVar18 = 8;
        lVar17 = 0;
        do {
          pdVar2 = ppdVar6[lVar17];
          lVar15 = (long)ppdVar6[lVar17 + 1] - (long)pdVar2;
          lVar16 = lVar15 >> 3;
          lVar11 = lVar17 - lVar16;
          lVar3 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          pdVar8 = x->fElem + lVar3 * lVar10 + lVar11 + 1;
          pdVar7 = ppdVar6[lVar17 + 1] + -1;
          dVar19 = 0.0;
          if (pdVar2 < pdVar7) {
            lVar14 = 0;
            do {
              pdVar1 = (double *)((long)pdVar7 + lVar14);
              dVar19 = dVar19 + *pdVar1 * *pdVar8;
              pdVar8 = pdVar8 + 1;
              lVar14 = lVar14 + -8;
            } while (pdVar2 < pdVar1 + -1);
            pdVar7 = (double *)((long)pdVar7 + lVar14);
            pdVar8 = (double *)
                     ((long)x->fElem + ((lVar3 * local_70 + lVar18 + lVar16 * -8) - lVar14));
          }
          if (pdVar7 == pdVar2) {
            dVar19 = dVar19 + *pdVar2 * *pdVar8;
          }
          lVar3 = (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar3 <= lVar17) || ((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)
             ) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar7 = z->fElem;
          lVar16 = lVar3 * lVar10;
          pdVar7[lVar16 + lVar17] = dVar19 * alpha + pdVar7[lVar16 + lVar17];
          if (((lVar11 < -1) || (lVar3 <= lVar11 + 1)) ||
             ((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (*(x->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
          )(x,lVar17);
          ppdVar6 = (this->fElem).fStore;
          pdVar8 = (double *)((long)ppdVar6[lVar17] + lVar15 + -8);
          if (pdVar2 < pdVar8) {
            pdVar7 = pdVar7 + lVar16 + lVar11 + 1;
            do {
              *pdVar7 = *pdVar8 * alpha * extraout_XMM0_Qa + *pdVar7;
              pdVar7 = pdVar7 + 1;
              pdVar8 = pdVar8 + -1;
            } while (pdVar2 < pdVar8);
          }
          lVar17 = lVar17 + 1;
          lVar18 = lVar18 + 8;
        } while (lVar17 != lVar4);
      }
      lVar10 = lVar10 + 1;
      local_70 = local_70 + 8;
    } while (lVar10 != lVar9);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}